

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

bool __thiscall
flatbuffers::php::PhpGenerator::SaveType
          (PhpGenerator *this,Definition *def,string *classcode,bool needs_imports)

{
  bool bVar1;
  undefined7 in_register_00000009;
  Namespace *ns;
  string filename;
  string code;
  string local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ns = (Namespace *)CONCAT71(in_register_00000009,needs_imports);
  if (classcode->_M_string_length == 0) {
    bVar1 = true;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"",(allocator<char> *)&local_a0);
    BaseGenerator::FullNamespace_abi_cxx11_
              (&local_a0,(BaseGenerator *)0x264ee7,(char *)def->defined_namespace,ns);
    BeginFile(this,&local_a0,needs_imports,&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::append((string *)&local_80);
    BaseGenerator::NamespaceDir_abi_cxx11_
              (&local_60,&this->super_BaseGenerator,def->defined_namespace,false);
    std::operator+(&local_40,&local_60,&def->name);
    std::operator+(&local_a0,&local_40,".php");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    bVar1 = SaveFile(local_a0._M_dataplus._M_p,&local_80,false);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return bVar1;
}

Assistant:

bool SaveType(const Definition &def, const std::string &classcode,
                bool needs_imports) {
    if (!classcode.length()) return true;

    std::string code = "";
    BeginFile(FullNamespace("\\", *def.defined_namespace), needs_imports,
              &code);
    code += classcode;

    std::string filename =
        NamespaceDir(*def.defined_namespace) + def.name + ".php";
    return SaveFile(filename.c_str(), code, false);
  }